

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task_impl.cpp
# Opt level: O2

MPP_RET mpp_task_queue_deinit(MppTaskQueue queue)

{
  uint uVar1;
  MppMeta meta;
  long lVar2;
  pthread_mutex_t *__mutex;
  pthread_cond_t *ppVar3;
  RK_S32 RVar4;
  uint uVar5;
  MPP_RET MVar6;
  RK_S32 i;
  ulong uVar7;
  long lVar8;
  
  if (queue == (MppTaskQueue)0x0) {
    _mpp_log_l(2,"mpp_task_impl","found NULL input queue\n","mpp_task_queue_deinit");
    MVar6 = MPP_ERR_NULL_PTR;
  }
  else {
    pthread_mutex_lock(*(pthread_mutex_t **)((long)queue + 0x28));
    *(undefined4 *)((long)queue + 0x34) = 0;
    pthread_cond_signal(*(pthread_cond_t **)((long)queue + 0x68));
    pthread_cond_signal(*(pthread_cond_t **)((long)queue + 0xa8));
    if (*(long *)((long)queue + 0x48) != 0) {
      lVar8 = 0;
      for (uVar7 = 0; (long)uVar7 < (long)*(int *)((long)queue + 0x30); uVar7 = uVar7 + 1) {
        meta = *(MppMeta *)((long)*(void **)((long)queue + 0x48) + lVar8 + 0x28);
        RVar4 = mpp_meta_size(meta);
        if (RVar4 != 0) {
          lVar2 = *(long *)((long)queue + 0x48);
          uVar1 = *(uint *)(lVar2 + 0x24 + lVar8);
          uVar5 = mpp_meta_size(meta);
          _mpp_log_l(2,"mpp_task_impl","%s queue idx %d task %p status %d meta size %d\n",
                     "mpp_task_queue_deinit",queue,uVar7 & 0xffffffff,lVar2 + lVar8,(ulong)uVar1,
                     (ulong)uVar5);
          mpp_meta_dump(meta);
        }
        mpp_meta_put(*(MppMeta *)(*(long *)((long)queue + 0x48) + 0x28 + lVar8));
        lVar8 = lVar8 + 0x30;
      }
      mpp_osal_free("mpp_task_queue_deinit",*(void **)((long)queue + 0x48));
    }
    if (*(MppPort *)((long)queue + 0x38) != (MppPort)0x0) {
      mpp_port_deinit(*(MppPort *)((long)queue + 0x38));
      *(undefined8 *)((long)queue + 0x38) = 0;
    }
    if (*(MppPort *)((long)queue + 0x40) != (MppPort)0x0) {
      mpp_port_deinit(*(MppPort *)((long)queue + 0x40));
      *(undefined8 *)((long)queue + 0x40) = 0;
    }
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)queue + 0x28));
    __mutex = *(pthread_mutex_t **)((long)queue + 0x28);
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(__mutex);
      operator_delete(__mutex,0x28);
    }
    ppVar3 = *(pthread_cond_t **)((long)queue + 0x68);
    if (ppVar3 != (pthread_cond_t *)0x0) {
      pthread_cond_destroy(ppVar3);
      operator_delete(ppVar3,0x30);
      *(undefined8 *)((long)queue + 0x68) = 0;
    }
    ppVar3 = *(pthread_cond_t **)((long)queue + 0xa8);
    if (ppVar3 != (pthread_cond_t *)0x0) {
      pthread_cond_destroy(ppVar3);
      operator_delete(ppVar3,0x30);
      *(undefined8 *)((long)queue + 0xa8) = 0;
    }
    mpp_osal_free("mpp_task_queue_deinit",queue);
    MVar6 = MPP_OK;
  }
  return MVar6;
}

Assistant:

MPP_RET mpp_task_queue_deinit(MppTaskQueue queue)
{
    if (NULL == queue) {
        mpp_err_f("found NULL input queue\n");
        return MPP_ERR_NULL_PTR;
    }

    MppTaskQueueImpl *p = (MppTaskQueueImpl *)queue;
    p->lock->lock();

    p->ready = 0;
    p->info[MPP_INPUT_PORT].cond->signal();
    p->info[MPP_OUTPUT_PORT].cond->signal();
    if (p->tasks) {
        for (RK_S32 i = 0; i < p->task_count; i++) {
            MppMeta meta = p->tasks[i].meta;

            /* we must ensure that all task return to init status */
            if (mpp_meta_size(meta)) {
                mpp_err_f("%s queue idx %d task %p status %d meta size %d\n",
                          p->name, i, &p->tasks[i], p->tasks[i].status,
                          mpp_meta_size(meta));
                mpp_meta_dump(meta);
            }
            mpp_meta_put(p->tasks[i].meta);
        }
        mpp_free(p->tasks);
    }

    if (p->input) {
        mpp_port_deinit(p->input);
        p->input = NULL;
    }
    if (p->output) {
        mpp_port_deinit(p->output);
        p->output = NULL;
    }
    p->lock->unlock();
    if (p->lock)
        delete p->lock;
    if (p->info[MPP_INPUT_PORT].cond) {
        delete p->info[MPP_INPUT_PORT].cond;
        p->info[MPP_INPUT_PORT].cond = NULL;
    }
    if (p->info[MPP_OUTPUT_PORT].cond) {
        delete p->info[MPP_OUTPUT_PORT].cond;
        p->info[MPP_OUTPUT_PORT].cond = NULL;
    }
    mpp_free(p);
    return MPP_OK;
}